

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall
mp::BasicSolver::UseOptionFile(BasicSolver *this,SolverOption *param_2,StringRef value)

{
  byte bVar1;
  BasicCStringRef<char> *this_00;
  int *piVar2;
  Error *this_01;
  long in_RDI;
  ifstream ifs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd8;
  undefined6 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcee;
  undefined1 in_stack_fffffffffffffcef;
  BasicStringRef<char> *in_stack_fffffffffffffd18;
  BasicStringRef<char> *this_02;
  undefined4 in_stack_fffffffffffffd24;
  int c;
  CStringRef in_stack_fffffffffffffd30;
  CStringRef in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd70;
  BasicStringRef<char> local_268 [2];
  undefined1 local_248 [520];
  string local_40 [64];
  
  fmt::BasicStringRef::operator_cast_to_string(in_stack_fffffffffffffd18);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x198),local_40);
  std::__cxx11::string::~string(local_40);
  this_02 = local_268;
  fmt::BasicStringRef::operator_cast_to_string(this_02);
  std::ifstream::ifstream(local_248,(string *)this_02,_S_in);
  std::__cxx11::string::~string((string *)local_268);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) != 0) {
    std::function<void(char_const*)>::
    function<mp::BasicSolver::UseOptionFile(mp::SolverOption_const&,fmt::BasicStringRef<char>)::__0,void>
              ((function<void_(const_char_*)> *)&stack0xfffffffffffffd68,
               (anon_class_8_1_8991fb9c *)
               CONCAT17(in_stack_fffffffffffffcef,
                        CONCAT16(in_stack_fffffffffffffcee,in_stack_fffffffffffffce8)));
    ProcessLines_AvoidComments
              ((istream *)in_stack_fffffffffffffd70,
               (function<void_(const_char_*)> *)in_stack_fffffffffffffd68);
    std::function<void_(const_char_*)>::~function((function<void_(const_char_*)> *)0x6e7444);
  }
  bVar1 = std::ios::good();
  if (((bVar1 & 1) == 0) && (bVar1 = std::ios::eof(), (bVar1 & 1) == 0)) {
    c = CONCAT13(1,(int3)in_stack_fffffffffffffd24);
    this_00 = (BasicCStringRef<char> *)__cxa_allocate_exception(0x18);
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xfffffffffffffd30,
               "Failed to read option file \'{}\': {}");
    piVar2 = __errno_location();
    this_01 = (Error *)strerror(*piVar2);
    fmt::format<fmt::BasicStringRef<char>,char*>
              (in_stack_fffffffffffffd38,(BasicStringRef<char> *)in_stack_fffffffffffffd30.data_,
               (char **)this_01);
    fmt::BasicCStringRef<char>::BasicCStringRef(this_00,in_stack_fffffffffffffcd8);
    Error::Error(this_01,in_stack_fffffffffffffd30,c);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  std::ifstream::~ifstream(local_248);
  return;
}

Assistant:

void BasicSolver::UseOptionFile(const SolverOption &, fmt::StringRef value) {
  option_file_save_ = value;
  std::ifstream ifs(value);
  if (ifs.good())
    ProcessLines_AvoidComments(ifs,
                               [this](const char* s)
    { ParseOptionString(s, option_flag_save_); });
  if (!ifs.good() && !ifs.eof())
    MP_RAISE(fmt::format("Failed to read option file '{}': {}",
                         value, std::strerror(errno)));
}